

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingPropertyExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::PropertyExprSyntax*&>
          (BumpAllocator *this,TimingControlSyntax *args,PropertyExprSyntax **args_1)

{
  ClockingPropertyExprSyntax *expr;
  TimingControlSyntax *in_RDX;
  ClockingPropertyExprSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  expr = (ClockingPropertyExprSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::ClockingPropertyExprSyntax::ClockingPropertyExprSyntax
            (in_RSI,in_RDX,(PropertyExprSyntax *)expr);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }